

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::ForceManager::~ForceManager(ForceManager *this)

{
  SwitchingFunction *pSVar1;
  
  this->_vptr_ForceManager = (_func_int **)&PTR__ForceManager_002c42f0;
  Utils::deletePointers<std::vector<OpenMD::ForceModifier*,std::allocator<OpenMD::ForceModifier*>>>
            (&this->forceModifiers_);
  pSVar1 = this->switcher_;
  if (pSVar1 != (SwitchingFunction *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pSVar1->switchSpline_).
                super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  operator_delete(pSVar1,0x40);
  if (this->interactionMan_ != (InteractionManager *)0x0) {
    (*this->interactionMan_->_vptr_InteractionManager[1])();
  }
  if (this->fDecomp_ != (ForceDecomposition *)0x0) {
    (*this->fDecomp_->_vptr_ForceDecomposition[1])();
  }
  operator_delete(this->thermo,8);
  SelectionEvaluator::~SelectionEvaluator(&this->evaluator_);
  SelectionManager::~SelectionManager(&this->seleMan_);
  std::__cxx11::string::~string((string *)&this->selectionScript_);
  std::_Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::
  ~_Vector_base(&(this->forceModifiers_).
                 super__Vector_base<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>
               );
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->electrostaticScale_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&(this->savedPositions_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->point_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->neighborList_).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<OpenMD::Inversion_*,_std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>,_std::_Select1st<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
  ::~_Rb_tree(&(this->inversionDataSets)._M_t);
  std::
  _Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
  ::~_Rb_tree(&(this->torsionDataSets)._M_t);
  std::
  _Rb_tree<OpenMD::Bend_*,_std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>,_std::_Select1st<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
  ::~_Rb_tree(&(this->bendDataSets)._M_t);
  std::
  _Vector_base<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
  ::~_Vector_base(&(this->interactions_).
                   super__Vector_base<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>,_std::allocator<std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>_>_>
                 );
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&(this->atomTypes_)._M_t);
  return;
}

Assistant:

ForceManager::~ForceManager() {
    Utils::deletePointers(forceModifiers_);

    delete switcher_;
    delete interactionMan_;
    delete fDecomp_;
    delete thermo;
  }